

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::ShaderModule>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  deUint32 *pdVar1;
  long *plVar2;
  undefined8 uVar3;
  VkAllocationCallbacks *allocator;
  DeviceInterface *vk;
  VkDevice device;
  const_iterator cVar4;
  size_t sVar5;
  size_t sVar6;
  char *__s;
  size_t sVar7;
  deUint64 *pdVar8;
  long *plVar9;
  int *piVar10;
  long lVar11;
  size_type __n;
  ulong uVar12;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  objects;
  AllocationCallbackRecorder allocRecorder;
  undefined1 local_238 [16];
  pointer local_228;
  VkAllocationCallbacks *pVStack_220;
  long local_210;
  VkDevice local_208;
  DeviceInterface *local_200;
  undefined1 local_1f8 [16];
  undefined8 local_1e8;
  VkAllocationCallbacks *pVStack_1e0;
  deUint32 *local_1d8;
  Move<vk::Handle<(vk::HandleType)14>_> local_1d0;
  undefined1 local_1b0 [8];
  VkAllocationCallbacks local_1a8 [2];
  ios_base local_138 [264];
  
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b0,allocator,0x400);
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  Context::getUniversalQueueFamilyIndex(context);
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  *)context->m_progCollection,&params->binaryName);
  lVar11 = *(long *)(cVar4._M_node + 2);
  sVar5 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b0);
  pdVar1 = *(deUint32 **)(lVar11 + 8);
  local_1f8._0_4_ = 0x10;
  local_1f8._8_8_ = (DeviceInterface *)0x0;
  local_1e8 = (VkDevice)((ulong)local_1e8._4_4_ << 0x20);
  pVStack_1e0 = (VkAllocationCallbacks *)(*(long *)(lVar11 + 0x10) - (long)pdVar1);
  local_1d8 = (deUint32 *)0x0;
  if (pVStack_1e0 != (VkAllocationCallbacks *)0x0) {
    local_1d8 = pdVar1;
  }
  ::vk::createShaderModule(&local_1d0,vk,device,(VkShaderModuleCreateInfo *)local_1f8,local_1a8);
  local_238._0_8_ =
       local_1d0.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal;
  local_238._8_8_ =
       local_1d0.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface;
  local_228 = (pointer)local_1d0.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                       m_device;
  pVStack_220 = local_1d0.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator;
  sVar6 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b0);
  if (local_238._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)14>_> *)(local_238 + 8),
               (VkShaderModule)local_238._0_8_);
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b0);
  sVar5 = getSafeObjectCount((Context *)context->m_testCtx->m_platform,sVar6 - sVar5,0);
  __n = 0x4000;
  if (sVar5 < 0x4000) {
    __n = sVar5;
  }
  local_200 = Context::getDeviceInterface(context);
  local_208 = Context::getDevice(context);
  Context::getUniversalQueueFamilyIndex(context);
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  *)context->m_progCollection,&params->binaryName);
  local_210 = *(long *)(cVar4._M_node + 2);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
            *)local_238,__n,(allocator_type *)local_1b0);
  local_1b0 = (undefined1  [8])context->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Creating ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
  __s = ::vk::getTypeName<vk::Handle<(vk::HandleType)14>>();
  if (__s == (char *)0x0) {
    std::ios::clear((int)local_1a8 + (int)*(undefined8 *)((long)local_1a8[0].pUserData + -0x18));
  }
  else {
    sVar7 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," objects",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if (sVar5 != 0) {
    lVar11 = 8;
    uVar12 = 0;
    do {
      pdVar8 = (deUint64 *)operator_new(0x20);
      local_1a8[0].pfnFree = *(PFN_vkFreeFunction *)(local_210 + 8);
      local_1b0._0_4_ = 0x10;
      local_1a8[0].pUserData = (void *)0x0;
      local_1a8[0].pfnAllocation._0_4_ = 0;
      local_1a8[0].pfnReallocation =
           (PFN_vkReallocationFunction)(*(long *)(local_210 + 0x10) - (long)local_1a8[0].pfnFree);
      if (local_1a8[0].pfnReallocation == (PFN_vkReallocationFunction)0x0) {
        local_1a8[0].pfnFree = (PFN_vkFreeFunction)0x0;
      }
      ::vk::createShaderModule
                ((Move<vk::Handle<(vk::HandleType)14>_> *)local_1f8,local_200,local_208,
                 (VkShaderModuleCreateInfo *)local_1b0,(VkAllocationCallbacks *)0x0);
      pdVar8[2] = (deUint64)local_1e8;
      pdVar8[3] = (deUint64)pVStack_1e0;
      *pdVar8 = local_1f8._0_8_;
      pdVar8[1] = local_1f8._8_8_;
      local_1f8._0_8_ = 0;
      local_1f8._8_8_ = (DeviceInterface *)0x0;
      local_1e8 = (VkDevice)0x0;
      pVStack_1e0 = (VkAllocationCallbacks *)0x0;
      plVar9 = (long *)operator_new(0x20);
      uVar3 = local_238._0_8_;
      *(undefined4 *)(plVar9 + 1) = 0;
      *(undefined4 *)((long)plVar9 + 0xc) = 0;
      *plVar9 = (long)&PTR__SharedPtrState_00d24990;
      plVar9[2] = (long)pdVar8;
      *(undefined4 *)(plVar9 + 1) = 1;
      *(undefined4 *)((long)plVar9 + 0xc) = 1;
      plVar2 = *(long **)((long)(Unique<vk::Handle<(vk::HandleType)14>_> **)local_238._0_8_ + lVar11
                         );
      if (plVar2 != plVar9) {
        if (plVar2 != (long *)0x0) {
          LOCK();
          plVar2 = plVar2 + 1;
          *(int *)plVar2 = (int)*plVar2 + -1;
          UNLOCK();
          if ((int)*plVar2 == 0) {
            *(undefined8 *)(local_238._0_8_ + lVar11 + -8) = 0;
            (**(code **)(**(long **)((long)(Unique<vk::Handle<(vk::HandleType)14>_> **)
                                           local_238._0_8_ + lVar11) + 0x10))();
          }
          LOCK();
          piVar10 = (int *)(*(long *)((long)(Unique<vk::Handle<(vk::HandleType)14>_> **)uVar3 +
                                     lVar11) + 0xc);
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (*piVar10 == 0) {
            plVar2 = *(long **)((long)(Unique<vk::Handle<(vk::HandleType)14>_> **)uVar3 + lVar11);
            if (plVar2 != (long *)0x0) {
              (**(code **)(*plVar2 + 8))();
            }
            *(undefined8 *)((long)(Unique<vk::Handle<(vk::HandleType)14>_> **)uVar3 + lVar11) = 0;
          }
        }
        *(deUint64 **)(uVar3 + lVar11 + -8) = pdVar8;
        *(long **)((long)(Unique<vk::Handle<(vk::HandleType)14>_> **)uVar3 + lVar11) = plVar9;
        LOCK();
        *(int *)(plVar9 + 1) = (int)plVar9[1] + 1;
        UNLOCK();
        LOCK();
        piVar10 = (int *)(*(long *)((long)(Unique<vk::Handle<(vk::HandleType)14>_> **)uVar3 + lVar11
                                   ) + 0xc);
        *piVar10 = *piVar10 + 1;
        UNLOCK();
      }
      plVar2 = plVar9 + 1;
      LOCK();
      *(int *)plVar2 = (int)*plVar2 + -1;
      UNLOCK();
      if ((int)*plVar2 == 0) {
        (**(code **)(*plVar9 + 0x10))(plVar9);
      }
      piVar10 = (int *)((long)plVar9 + 0xc);
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        (**(code **)(*plVar9 + 8))(plVar9);
      }
      if (local_1f8._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)14>_> *)(local_1f8 + 8),
                   (VkShaderModule)local_1f8._0_8_);
      }
      if ((uVar12 & 0x3ff) == 0 && uVar12 != 0) {
        tcu::TestContext::touchWatchdog(context->m_testCtx);
      }
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 0x10;
    } while (__n != uVar12);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ::_M_erase_at_end((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
                     *)local_238,(pointer)local_238._0_8_);
  local_1b0 = (undefined1  [8])&local_1a8[0].pfnAllocation;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_1b0,
             (undefined1 *)((long)local_1a8[0].pUserData + (long)local_1b0));
  if (local_1b0 != (undefined1  [8])&local_1a8[0].pfnAllocation) {
    operator_delete((void *)local_1b0,
                    CONCAT44(local_1a8[0].pfnAllocation._4_4_,
                             (VkShaderModuleCreateFlags)local_1a8[0].pfnAllocation) + 1);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
             *)local_238);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}